

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

void do_cmd_takeoff(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *local_18;
  object *obj;
  command *cmd_local;
  
  obj = (object *)cmd;
  _Var1 = player_get_resume_normal_shape(player,(command_conflict *)cmd);
  if ((_Var1) &&
     (wVar2 = cmd_get_item((command *)obj,"item",&local_18,"Take off or unwield which item?",
                           "You have nothing to take off or unwield.",obj_can_takeoff,L'\x01'),
     wVar2 == L'\0')) {
    inven_takeoff(local_18);
    combine_pack(player);
    pack_overflow(local_18);
    player->upkeep->energy_use = z_info->move_energy / 2;
  }
  return;
}

Assistant:

void do_cmd_takeoff(struct command *cmd)
{
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Get arguments */
	if (cmd_get_item(cmd, "item", &obj,
			/* Prompt */ "Take off or unwield which item?",
			/* Error  */ "You have nothing to take off or unwield.",
			/* Filter */ obj_can_takeoff,
			/* Choice */ USE_EQUIP) != CMD_OK)
		return;

	inven_takeoff(obj);
	combine_pack(player);
	pack_overflow(obj);
	player->upkeep->energy_use = z_info->move_energy / 2;
}